

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O3

size_type __thiscall llvm::StringRef::find_first_of(StringRef *this,StringRef Chars,size_t From)

{
  _WordT *p_Var1;
  ulong uVar2;
  bool bVar3;
  size_t sVar4;
  bitset<256UL> CharBits;
  bitset<256UL> local_48;
  
  local_48.super__Base_bitset<4UL>._M_w[2] = 0;
  local_48.super__Base_bitset<4UL>._M_w[3] = 0;
  local_48.super__Base_bitset<4UL>._M_w[0] = 0;
  local_48.super__Base_bitset<4UL>._M_w[1] = 0;
  if (Chars.Length != 0) {
    sVar4 = 0;
    do {
      p_Var1 = local_48.super__Base_bitset<4UL>._M_w + ((byte)Chars.Data[sVar4] >> 6);
      *p_Var1 = *p_Var1 | 1L << (Chars.Data[sVar4] & 0x3fU);
      sVar4 = sVar4 + 1;
    } while (Chars.Length != sVar4);
  }
  uVar2 = this->Length;
  if (From < uVar2) {
    do {
      bVar3 = std::bitset<256UL>::test(&local_48,(ulong)(byte)this->Data[From]);
      if (bVar3) {
        return From;
      }
      From = From + 1;
    } while (uVar2 != From);
  }
  return 0xffffffffffffffff;
}

Assistant:

StringRef::size_type StringRef::find_first_of(StringRef Chars,
                                              size_t From) const {
  std::bitset<1 << CHAR_BIT> CharBits;
  for (size_type i = 0; i != Chars.size(); ++i)
    CharBits.set((unsigned char)Chars[i]);

  for (size_type i = std::min(From, Length), e = Length; i != e; ++i)
    if (CharBits.test((unsigned char)Data[i]))
      return i;
  return npos;
}